

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  int iVar1;
  long lVar2;
  sqlite3_io_methods *psVar3;
  sqlite3_io_methods *psVar4;
  sqlite3_io_methods *psVar5;
  sqlite3_io_methods *psVar6;
  sqlite3_io_methods *psVar7;
  bool bVar8;
  sqlite3_io_methods *psVar9;
  sqlite3_io_methods *psVar10;
  int iVar11;
  int iVar12;
  sqlite3_io_methods *psVar13;
  sqlite3_file sVar14;
  sqlite3_io_methods *psVar15;
  long lVar16;
  FileChunk *pIter;
  sqlite3_io_methods *psVar17;
  int iVar18;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar12 = *(int *)((long)&pJfd[1].pMethods + 4);
  if (((long)iVar12 < 1) || (iAmt + iOfst <= (long)iVar12)) {
    if (iOfst < 1) {
      if ((iOfst != 0) || (pJfd[2].pMethods == (sqlite3_io_methods *)0x0)) goto LAB_0012ba8d;
      memcpy(&(pJfd[2].pMethods)->xClose,zBuf,(long)iAmt);
    }
    else {
      if (pJfd[3].pMethods != (sqlite3_io_methods *)iOfst) {
        memjrnlTruncate(pJfd,iOfst);
      }
LAB_0012ba8d:
      iVar11 = 0;
      if (iAmt < 1) goto LAB_0012bbd9;
      psVar13 = pJfd[3].pMethods;
      do {
        psVar15 = pJfd[4].pMethods;
        iVar12 = *(int *)&pJfd[1].pMethods;
        lVar16 = (long)psVar13 % (long)iVar12;
        iVar11 = iVar12 - (int)lVar16;
        if (iAmt < iVar11) {
          iVar11 = iAmt;
        }
        sVar14.pMethods = psVar15;
        if (lVar16 == 0) {
          sVar14.pMethods = (sqlite3_io_methods *)sqlite3_malloc(iVar12 + 8);
          if (sVar14.pMethods == (sqlite3_io_methods *)0x0) {
            iVar11 = 0xc0a;
            goto LAB_0012bbd9;
          }
          if (psVar15 == (sqlite3_io_methods *)0x0) {
            psVar15 = (sqlite3_io_methods *)(pJfd + 2);
          }
          *(undefined8 *)sVar14.pMethods = 0;
          *(sqlite3_io_methods **)psVar15 = sVar14.pMethods;
          pJfd[4].pMethods = sVar14.pMethods;
        }
        __n = (size_t)iVar11;
        memcpy((void *)((long)&(sVar14.pMethods)->xClose + lVar16),zBuf,__n);
        zBuf = (void *)((long)zBuf + __n);
        psVar13 = (sqlite3_io_methods *)((long)&(pJfd[3].pMethods)->iVersion + __n);
        pJfd[3].pMethods = psVar13;
        iVar12 = iAmt - iVar11;
        bVar8 = iVar11 <= iAmt;
        iAmt = iVar12;
      } while (iVar12 != 0 && bVar8);
    }
    iVar11 = 0;
  }
  else {
    psVar13 = pJfd->pMethods;
    iVar1 = *(int *)&pJfd[1].pMethods;
    psVar15 = pJfd[2].pMethods;
    psVar3 = pJfd[3].pMethods;
    psVar4 = pJfd[6].pMethods;
    psVar9 = pJfd[4].pMethods;
    psVar10 = pJfd[5].pMethods;
    psVar5 = pJfd[7].pMethods;
    psVar6 = pJfd[8].pMethods;
    psVar7 = pJfd[9].pMethods;
    pJfd->pMethods = (sqlite3_io_methods *)0x0;
    pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[8].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[9].pMethods = (sqlite3_io_methods *)0x0;
    iVar11 = (*psVar6->xSync)((sqlite3_file *)psVar6,(int)psVar7);
    if (iVar11 == 0) {
      if (psVar15 != (sqlite3_io_methods *)0x0) {
        lVar16 = 0;
        psVar17 = psVar15;
        iVar18 = iVar1;
        do {
          if ((long)psVar3 < lVar16 + iVar18) {
            iVar18 = (int)psVar3 - (int)lVar16;
          }
          iVar11 = (*pJfd->pMethods->xWrite)(pJfd,&psVar17->xClose,iVar18,lVar16);
          if (iVar11 != 0) goto LAB_0012b9fc;
          lVar16 = lVar16 + iVar18;
          psVar17 = *(sqlite3_io_methods **)psVar17;
        } while (psVar17 != (sqlite3_io_methods *)0x0);
        do {
          psVar13 = *(sqlite3_io_methods **)psVar15;
          sqlite3_free(psVar15);
          psVar15 = psVar13;
        } while (psVar13 != (sqlite3_io_methods *)0x0);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        iVar12 = (*pJfd->pMethods->xWrite)(pJfd,zBuf,iAmt,iOfst);
        return iVar12;
      }
      goto LAB_0012bc2e;
    }
LAB_0012b9fc:
    if (pJfd->pMethods != (sqlite3_io_methods *)0x0) {
      (*pJfd->pMethods->xClose)(pJfd);
    }
    pJfd->pMethods = psVar13;
    *(int *)&pJfd[1].pMethods = iVar1;
    *(int *)((long)&pJfd[1].pMethods + 4) = iVar12;
    pJfd[2].pMethods = psVar15;
    pJfd[3].pMethods = psVar3;
    pJfd[6].pMethods = psVar4;
    pJfd[4].pMethods = psVar9;
    pJfd[5].pMethods = psVar10;
    pJfd[7].pMethods = psVar5;
    pJfd[8].pMethods = psVar6;
    pJfd[9].pMethods = psVar7;
  }
LAB_0012bbd9:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar11;
  }
LAB_0012bc2e:
  __stack_chk_fail();
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */
    assert( iOfst<=p->endpoint.iOffset );
    if( iOfst>0 && iOfst!=p->endpoint.iOffset ){
      memjrnlTruncate(pJfd, iOfst);
    }
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else{
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        assert( pChunk!=0 || iChunkOffset==0 );
        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          pChunk = p->endpoint.pChunk = pNew;
        }

        assert( pChunk!=0 );
        memcpy((u8*)pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
    }
  }

  return SQLITE_OK;
}